

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O1

int nng_sub0_ctx_subscribe(nng_ctx id,void *buf,size_t sz)

{
  int iVar1;
  nni_ctx *in_RAX;
  nni_proto_ctx_ops *pnVar2;
  sub0_ctx *ctx;
  nni_ctx *local_28;
  nni_ctx *c;
  
  local_28 = in_RAX;
  iVar1 = nni_ctx_find(&local_28,id.id);
  if (iVar1 == 0) {
    pnVar2 = nni_ctx_proto_ops(local_28);
    iVar1 = 9;
    if (pnVar2->ctx_init == sub0_ctx_init) {
      ctx = (sub0_ctx *)nni_ctx_proto_data(local_28);
      iVar1 = sub0_ctx_subscribe(ctx,buf,sz);
    }
    nni_ctx_rele(local_28);
  }
  return iVar1;
}

Assistant:

int
nng_sub0_ctx_subscribe(nng_ctx id, const void *buf, size_t sz)
{
	int       rv;
	nni_ctx  *c;
	sub0_ctx *ctx;

	if ((rv = nni_ctx_find(&c, id.id)) != 0) {
		return (rv);
	}
	// validate the socket type
	if (nni_ctx_proto_ops(c)->ctx_init != sub0_ctx_init) {
		nni_ctx_rele(c);
		return (NNG_ENOTSUP);
	}
	ctx = nni_ctx_proto_data(c);
	rv  = sub0_ctx_subscribe(ctx, buf, sz);
	nni_ctx_rele(c);
	return (rv);
}